

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O2

int jpeg_huff_decode(bitread_working_state *state,bit_buf_type get_buffer,int bits_left,
                    d_derived_tbl *htbl,int min_bits)

{
  j_decompress_ptr pjVar1;
  jpeg_error_mgr *pjVar2;
  boolean bVar3;
  int bits_left_00;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  
  if (bits_left < min_bits) {
    bVar3 = jpeg_fill_bit_buffer(state,get_buffer,bits_left,min_bits);
    if (bVar3 == 0) {
      return -1;
    }
    get_buffer = state->get_buffer;
    bits_left = state->bits_left;
  }
  uVar4 = (ulong)(uint)(bits_left - min_bits);
  uVar6 = (ulong)(int)((uint)(get_buffer >> ((byte)(bits_left - min_bits) & 0x3f)) &
                      bmask[(uint)min_bits]);
  lVar7 = (long)min_bits;
  do {
    bits_left_00 = (int)uVar4;
    if ((long)uVar6 <= htbl->maxcode[lVar7]) {
      state->get_buffer = get_buffer;
      state->bits_left = bits_left_00;
      if (lVar7 < 0x11) {
        uVar5 = (uint)htbl->pub->huffval[(int)uVar6 + (int)htbl->valoffset[lVar7]];
      }
      else {
        pjVar1 = state->cinfo;
        pjVar2 = pjVar1->err;
        pjVar2->msg_code = 0x79;
        (*pjVar2->emit_message)((j_common_ptr)pjVar1,-1);
        uVar5 = 0;
      }
      return uVar5;
    }
    if (bits_left_00 < 1) {
      bVar3 = jpeg_fill_bit_buffer(state,get_buffer,bits_left_00,1);
      if (bVar3 == 0) {
        return -1;
      }
      get_buffer = state->get_buffer;
      bits_left_00 = state->bits_left;
    }
    uVar4 = (ulong)(bits_left_00 - 1);
    uVar6 = uVar6 * 2 | (ulong)(((ulong)get_buffer >> (uVar4 & 0x3f) & 1) != 0);
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

LOCAL(int)
jpeg_huff_decode (bitread_working_state * state,
		  register bit_buf_type get_buffer, register int bits_left,
		  d_derived_tbl * htbl, int min_bits)
{
  register int l = min_bits;
  register INT32 code;

  /* HUFF_DECODE has determined that the code is at least min_bits */
  /* bits long, so fetch that many bits in one swoop. */

  CHECK_BIT_BUFFER(*state, l, return -1);
  code = GET_BITS(l);

  /* Collect the rest of the Huffman code one bit at a time. */
  /* This is per Figure F.16 in the JPEG spec. */

  while (code > htbl->maxcode[l]) {
    code <<= 1;
    CHECK_BIT_BUFFER(*state, 1, return -1);
    code |= GET_BITS(1);
    l++;
  }

  /* Unload the local registers */
  state->get_buffer = get_buffer;
  state->bits_left = bits_left;

  /* With garbage input we may reach the sentinel value l = 17. */

  if (l > 16) {
    WARNMS(state->cinfo, JWRN_HUFF_BAD_CODE);
    return 0;			/* fake a zero as the safest result */
  }

  return htbl->pub->huffval[ (int) (code + htbl->valoffset[l]) ];
}